

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O1

int Cba_NtkCiFonNum(Cba_Ntk_t *p)

{
  uint uVar1;
  int *piVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  iVar3 = (p->vInputs).nSize;
  lVar4 = (long)(p->vSeq).nSize;
  if (0 < lVar4) {
    lVar5 = 0;
    do {
      uVar1 = (p->vSeq).pArray[lVar5];
      if ((int)uVar1 < 1) {
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cba.h"
                      ,0xec,"int Cba_ObjFonNum(Cba_Ntk_t *, int)");
      }
      if ((p->vObjFon0).nSize <= (int)(uVar1 + 1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar2 = (p->vObjFon0).pArray;
      iVar3 = (iVar3 + piVar2[(ulong)uVar1 + 1]) - piVar2[uVar1];
      lVar5 = lVar5 + 1;
    } while (lVar4 != lVar5);
  }
  return iVar3;
}

Assistant:

int Cba_NtkCiFonNum( Cba_Ntk_t * p )
{
    int i, iObj, Count = Cba_NtkPiNum(p);
    Cba_NtkForEachBoxSeq( p, iObj, i )
        Count += Cba_ObjFonNum(p, iObj);
    return Count;  
}